

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

int htmlSaveFileFormat(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  xmlParserErrors xVar2;
  int iVar3;
  xmlOutputBufferPtr buf;
  xmlChar *encoding_00;
  char *name;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandler *local_30;
  
  local_30 = (xmlCharEncodingHandlerPtr)0x0;
  iVar3 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    name = "HTML";
    if (encoding != (char *)0x0) {
      name = encoding;
    }
    xVar2 = xmlOpenCharEncodingHandler(name,1,&local_30);
    if (xVar2 == XML_ERR_OK) {
      if (local_30 == (xmlCharEncodingHandlerPtr)0x0) {
        encoding_00 = "UTF-8";
      }
      else {
        encoding_00 = (xmlChar *)local_30->name;
      }
      htmlSetMetaEncoding(cur,encoding_00);
      iVar3 = 0;
      buf = xmlOutputBufferCreateFilename(filename,local_30,0);
      if (buf != (xmlOutputBufferPtr)0x0) {
        xVar1 = cur->type;
        cur->type = XML_HTML_DOCUMENT_NODE;
        htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,(char *)0x0,format);
        cur->type = xVar1;
        iVar3 = xmlOutputBufferClose(buf);
      }
    }
  }
  return iVar3;
}

Assistant:

int
htmlSaveFileFormat(const char *filename, xmlDocPtr cur,
	           const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    if (handler != NULL)
        htmlSetMetaEncoding(cur, (const xmlChar *) handler->name);
    else
	htmlSetMetaEncoding(cur, (const xmlChar *) "UTF-8");

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, 0);
    if (buf == NULL)
        return(0);

    htmlDocContentDumpFormatOutput(buf, cur, encoding, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}